

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O0

string * short_name_abi_cxx11_(string *__return_storage_ptr__,Encoding *encoding)

{
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  Encoding *local_18;
  Encoding *encoding_local;
  
  local_18 = encoding;
  encoding_local = (Encoding *)__return_storage_ptr__;
  switch(*encoding) {
  case Unknown:
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unk",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  case MFM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"mfm",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case FM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"fm",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case RX02:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"rx",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case Amiga:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ami",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case GCR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"gcr",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case Ace:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ace",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case MX:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"mx",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case Agat:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"agat",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  case Apple:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"a2",&local_34);
    std::allocator<char>::~allocator(&local_34);
    break;
  case Victor:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"vic",&local_35);
    std::allocator<char>::~allocator(&local_35);
    break;
  case Vista:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"vis",&local_36);
    std::allocator<char>::~allocator(&local_36);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string short_name(const Encoding& encoding)
{
    switch (encoding)
    {
    case Encoding::MFM:     return "mfm";           break;
    case Encoding::FM:      return "fm";            break;
    case Encoding::RX02:    return "rx";            break;
    case Encoding::Amiga:   return "ami";           break;
    case Encoding::GCR:     return "gcr";           break;
    case Encoding::Ace:     return "ace";           break;
    case Encoding::MX:      return "mx";            break;
    case Encoding::Agat:    return "agat";          break;
    case Encoding::Apple:   return "a2";            break;
    case Encoding::Victor:  return "vic";           break;
    case Encoding::Vista:   return "vis";           break;
    case Encoding::Unknown: break;
    }
    return "unk";
}